

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O2

int clickhouse::SocketConnect
              (NetworkAddress *addr,optional<clickhouse::SocketTimeoutParams> *socket_timeout_params
              )

{
  NetworkAddress NVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  ssize_t sVar5;
  system_error *psVar6;
  error_category *peVar7;
  int local_64;
  int err;
  socklen_t len;
  pollfd fd;
  __time_t local_48;
  __suseconds_t _Stack_40;
  
  local_64 = 0;
  do {
    NVar1.info_ = addr->info_;
    if (NVar1.info_ == (addrinfo *)0x0) {
      psVar6 = (system_error *)__cxa_allocate_exception(0x20);
      if (local_64 < 1) {
        piVar4 = __errno_location();
        iVar2 = *piVar4;
        peVar7 = (error_category *)std::_V2::system_category();
        std::system_error::system_error(psVar6,iVar2,peVar7,"fail to connect");
      }
      else {
        peVar7 = (error_category *)std::_V2::system_category();
        std::system_error::system_error(psVar6,local_64,peVar7,"fail to connect");
      }
      __cxa_throw(psVar6,&std::system_error::typeinfo,std::system_error::~system_error);
    }
    iVar2 = socket((NVar1.info_)->ai_family,(NVar1.info_)->ai_socktype,(NVar1.info_)->ai_protocol);
    if (iVar2 != -1) {
      anon_unknown_4::SetNonBlock(iVar2,true);
      if ((socket_timeout_params->super__Optional_base<clickhouse::SocketTimeoutParams,_true,_true>)
          ._M_payload.super__Optional_payload_base<clickhouse::SocketTimeoutParams>._M_engaged ==
          true) {
        fd = (pollfd)(socket_timeout_params->
                     super__Optional_base<clickhouse::SocketTimeoutParams,_true,_true>)._M_payload.
                     super__Optional_payload_base<clickhouse::SocketTimeoutParams>._M_payload.
                     _M_value.recv_timeout_.tv_sec;
        local_48 = (socket_timeout_params->
                   super__Optional_base<clickhouse::SocketTimeoutParams,_true,_true>)._M_payload.
                   super__Optional_payload_base<clickhouse::SocketTimeoutParams>._M_payload._M_value
                   .send_timeout_.tv_sec;
        _Stack_40 = (socket_timeout_params->
                    super__Optional_base<clickhouse::SocketTimeoutParams,_true,_true>)._M_payload.
                    super__Optional_payload_base<clickhouse::SocketTimeoutParams>._M_payload.
                    _M_value.send_timeout_.tv_usec;
        iVar3 = setsockopt(iVar2,1,0x14,&fd,0x10);
        if (iVar3 < 0) {
          psVar6 = (system_error *)__cxa_allocate_exception(0x20);
          piVar4 = __errno_location();
          iVar2 = *piVar4;
          peVar7 = (error_category *)std::_V2::system_category();
          std::system_error::system_error(psVar6,iVar2,peVar7,"failed to setsockopt(SO_RCVTIMEO)");
          goto LAB_0014dc33;
        }
        iVar3 = setsockopt(iVar2,1,0x15,&local_48,0x10);
        if (iVar3 < 0) {
          psVar6 = (system_error *)__cxa_allocate_exception(0x20);
          piVar4 = __errno_location();
          iVar2 = *piVar4;
          peVar7 = (error_category *)std::_V2::system_category();
          std::system_error::system_error(psVar6,iVar2,peVar7,"failed to setsockopt(SO_SNDTIMEO)");
          goto LAB_0014dc33;
        }
      }
      iVar3 = connect(iVar2,(sockaddr *)(NVar1.info_)->ai_addr,(NVar1.info_)->ai_addrlen);
      if (iVar3 == 0) {
LAB_0014db30:
        anon_unknown_4::SetNonBlock(iVar2,false);
        return iVar2;
      }
      piVar4 = __errno_location();
      err = *piVar4;
      if ((err == 0x73) || (err == 0xb)) {
        fd.events = 4;
        fd.revents = 0;
        fd.fd = iVar2;
        sVar5 = Poll(&fd,1,5000);
        if (sVar5 == -1) {
          psVar6 = (system_error *)__cxa_allocate_exception(0x20);
          iVar2 = *piVar4;
          peVar7 = (error_category *)std::_V2::system_category();
          std::system_error::system_error(psVar6,iVar2,peVar7,"fail to connect");
LAB_0014dc33:
          __cxa_throw(psVar6,&std::system_error::typeinfo,std::system_error::~system_error);
        }
        if (0 < sVar5) {
          len = 4;
          getsockopt(iVar2,1,4,&err,&len);
          local_64 = err;
          if (err == 0) goto LAB_0014db30;
        }
      }
    }
    addr = (NetworkAddress *)&(NVar1.info_)->ai_next;
  } while( true );
}

Assistant:

SOCKET SocketConnect(const NetworkAddress& addr, const std::optional<SocketTimeoutParams>& socket_timeout_params) {
    int last_err = 0;
    for (auto res = addr.Info(); res != nullptr; res = res->ai_next) {
        SOCKET s(socket(res->ai_family, res->ai_socktype, res->ai_protocol));

        if (s == -1) {
            continue;
        }

        SetNonBlock(s, true);
        if(socket_timeout_params) {
            SetTimeout(s, *socket_timeout_params);
        }

        if (connect(s, res->ai_addr, (int)res->ai_addrlen) != 0) {
            int err = errno;
            if (err == EINPROGRESS || err == EAGAIN || err == EWOULDBLOCK) {
                pollfd fd;
                fd.fd = s;
                fd.events = POLLOUT;
                fd.revents = 0;
                ssize_t rval = Poll(&fd, 1, 5000);

                if (rval == -1) {
                    throw std::system_error(errno, std::system_category(), "fail to connect");
                }
                if (rval > 0) {
                    socklen_t len = sizeof(err);
                    getsockopt(s, SOL_SOCKET, SO_ERROR, (char*)&err, &len);

                    if (!err) {
                        SetNonBlock(s, false);
                        return s;
                    }
                   last_err = err;
                }
            }
        } else {
            SetNonBlock(s, false);
            return s;
        }
    }
    if (last_err > 0) {
        throw std::system_error(last_err, std::system_category(), "fail to connect");
    }
    throw std::system_error(
        errno, std::system_category(), "fail to connect"
    );
}